

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_lxvd2x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 val;
  TCGv_i64 EA;
  uintptr_t o;
  uintptr_t o_1;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    val = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx,0x20);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    gen_qemu_ld64_i64(ctx,val,EA);
    set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,val);
    tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
    gen_qemu_ld64_i64(ctx,val,EA);
    set_cpu_vsrl(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,val);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_lxvd2x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    gen_qemu_ld64_i64(ctx, t0, EA);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), t0);
    tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
    gen_qemu_ld64_i64(ctx, t0, EA);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), t0);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}